

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lejp.c
# Opt level: O1

char cb(lejp_ctx *ctx,char reason)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char buf [1024];
  char local_438;
  char acStack_437 [1023];
  undefined1 local_38 [8];
  
  bVar1 = ctx->sp;
  if ((ulong)bVar1 == 0) {
    pcVar4 = &local_438;
  }
  else {
    memset(&local_438,0x20,(ulong)bVar1);
    pcVar4 = acStack_437 + (bVar1 - 1);
  }
  *pcVar4 = '\0';
  if ((reason & 0x40U) == 0) {
    if (reason == '\x05') {
      _lws_log(4,"%spath: \'%s\' (LEJPCB_PAIR_NAME)\n",&local_438,ctx->path);
    }
    else if (reason == '\x03') {
      _lws_log(4,"%sParsing Completed (LEJPCB_COMPLETE)\n",&local_438);
    }
    _lws_log(4,"%s%s: path %s match %d statckp %d\r\n",&local_438,reason_names[(byte)reason & 0x3f],
             ctx->path,(ulong)ctx->path_match,(uint)ctx->pst[ctx->pst_sp].ppos);
  }
  else {
    iVar2 = lws_snprintf(pcVar4,(long)pcVar4 - (long)local_38,"   value \'%s\' ",ctx->buf);
    if (ctx->ipos != '\0') {
      pcVar4 = pcVar4 + iVar2;
      iVar2 = lws_snprintf(pcVar4,(long)pcVar4 - (long)local_38,"(array indexes: ");
      pcVar4 = pcVar4 + iVar2;
      if (ctx->ipos != '\0') {
        uVar3 = 0;
        do {
          iVar2 = lws_snprintf(pcVar4,(long)pcVar4 - (long)local_38,"%d ",(ulong)ctx->i[uVar3]);
          pcVar4 = pcVar4 + iVar2;
          uVar3 = uVar3 + 1;
        } while (uVar3 < ctx->ipos);
      }
      lws_snprintf(pcVar4,(long)pcVar4 - (long)local_38,") ");
    }
    _lws_log(4,"%s (%s)\r\n",&local_438,reason_names[(byte)reason & 0x3f]);
  }
  return '\0';
}

Assistant:

static signed char
cb(struct lejp_ctx *ctx, char reason)
{
	char buf[1024], *p = buf, *end = &buf[sizeof(buf)];
	int n;

	for (n = 0; n < ctx->sp; n++)
		*p++ = ' ';
	*p = '\0';

	if (reason & LEJP_FLAG_CB_IS_VALUE) {
		p += lws_snprintf(p, p - end, "   value '%s' ", ctx->buf);
		if (ctx->ipos) {
			int n;

			p += lws_snprintf(p, p - end, "(array indexes: ");
			for (n = 0; n < ctx->ipos; n++)
				p += lws_snprintf(p, p - end, "%d ", ctx->i[n]);
			p += lws_snprintf(p, p - end, ") ");
		}
		lwsl_notice("%s (%s)\r\n", buf,
		       reason_names[(unsigned int)
			(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)]);

		(void)reason_names; /* NO_LOGS... */
		return 0;
	}

	switch (reason) {
	case LEJPCB_COMPLETE:
		lwsl_notice("%sParsing Completed (LEJPCB_COMPLETE)\n", buf);
		break;
	case LEJPCB_PAIR_NAME:
		lwsl_notice("%spath: '%s' (LEJPCB_PAIR_NAME)\n", buf, ctx->path);
		break;
	}

	lwsl_notice("%s%s: path %s match %d statckp %d\r\n", buf, reason_names[(unsigned int)
		(reason) & (LEJP_FLAG_CB_IS_VALUE - 1)], ctx->path,
		ctx->path_match, ctx->pst[ctx->pst_sp].ppos);

	return 0;
}